

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O1

ParameterError
parse_header(GlobalConfig *global,OperationConfig *config,cmdline_t cmd,char *nextarg)

{
  _Bool _Var1;
  ParameterError PVar2;
  ParameterError PVar3;
  FILE *__stream;
  char *pcVar4;
  curl_slist **list;
  _Bool error;
  dynbuf line;
  _Bool local_55;
  int local_54;
  dynbuf local_50;
  
  if (*nextarg != '@') {
    if (cmd == C_PROXY_HEADER) {
      list = &config->proxyheaders;
    }
    else {
      list = &config->headers;
    }
    PVar2 = add2list(list,nextarg);
    return PVar2;
  }
  pcVar4 = nextarg + 1;
  local_54 = strcmp(pcVar4,"-");
  __stream = _stdin;
  if (local_54 != 0) {
    __stream = fopen64(pcVar4,"r");
  }
  if (__stream == (FILE *)0x0) {
    errorf(global,"Failed to open %s",pcVar4);
    PVar2 = PARAM_READ_ERROR;
  }
  else {
    local_55 = false;
    curlx_dyn_init(&local_50,0x19000);
    _Var1 = my_get_line((FILE *)__stream,&local_50,&local_55);
    PVar3 = PARAM_OK;
    if (_Var1) {
      do {
        pcVar4 = curlx_dyn_ptr(&local_50);
        PVar3 = add2list(&config->headers + (cmd == C_PROXY_HEADER),pcVar4);
        if (PVar3 != PARAM_OK) break;
        _Var1 = my_get_line((FILE *)__stream,&local_50,&local_55);
      } while (_Var1);
    }
    PVar2 = PARAM_READ_ERROR;
    if (local_55 == false) {
      PVar2 = PVar3;
    }
    curlx_dyn_free(&local_50);
    if (local_54 != 0) {
      fclose(__stream);
    }
  }
  return PVar2;
}

Assistant:

static ParameterError parse_header(struct GlobalConfig *global,
                                   struct OperationConfig *config,
                                   cmdline_t cmd,
                                   const char *nextarg)
{
  ParameterError err = PARAM_OK;

  /* A custom header to append to a list */
  if(nextarg[0] == '@') {
    /* read many headers from a file or stdin */
    bool use_stdin = !strcmp(&nextarg[1], "-");
    FILE *file = use_stdin ? stdin : fopen(&nextarg[1], FOPEN_READTEXT);
    if(!file) {
      errorf(global, "Failed to open %s", &nextarg[1]);
      err = PARAM_READ_ERROR;
    }
    else {
      struct dynbuf line;
      bool error = FALSE;
      curlx_dyn_init(&line, 1024*100);
      while(my_get_line(file, &line, &error)) {
        const char *ptr = curlx_dyn_ptr(&line);
        err = add2list(cmd == C_PROXY_HEADER ? /* --proxy-header? */
                       &config->proxyheaders :
                       &config->headers, ptr);
        if(err)
          break;
      }
      if(error)
        err = PARAM_READ_ERROR;
      curlx_dyn_free(&line);
      if(!use_stdin)
        fclose(file);
    }
  }
  else {
    if(cmd == C_PROXY_HEADER) /* --proxy-header */
      err = add2list(&config->proxyheaders, nextarg);
    else
      err = add2list(&config->headers, nextarg);
  }
  return err;
}